

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O3

void __thiscall
Centaurus::MyConstPool::load_charclass_filter<wchar_t>
          (MyConstPool *this,X86Xmm *dest,CharClass<wchar_t> *cc)

{
  size_t offset;
  Data128 data;
  uint32_t local_40 [2];
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  Data128 local_28;
  
  local_28 = pack_charclass((Centaurus *)
                            (cc->m_ranges).
                            super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (CharClass<wchar_t> *)
                            (cc->m_ranges).
                            super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  asmjit::ConstPool::add(&this->m_pool,&local_28,0x10,(size_t *)local_40);
  local_38._packed[0] = (UInt64)0xa;
  local_38._any.reserved12_4 = (this->m_label).super_Operand.super_Operand_.field_0._any.id;
  local_38._any.reserved8_4 = local_40[0];
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)this->m_as,400,(Operand_ *)dest,(Operand_ *)&local_38._any);
  return;
}

Assistant:

void load_charclass_filter(asmjit::X86Xmm dest, const CharClass<TCHAR>& cc)
    {
        asmjit::Data128 data = pack_charclass(cc);

        size_t offset;
        m_pool.add(&data, 16, offset);

        m_as.movdqa(dest, asmjit::X86Mem(m_label, offset));
    }